

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlChar * xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal,xmlChar *pubID,xmlChar *sysID)

{
  xmlCatalogEntryType xVar1;
  xmlCatalogEntryPtr catal_00;
  bool bVar2;
  _xmlCatalogEntry **pp_Var3;
  int iVar4;
  uint len;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  long lVar8;
  xmlChar *sysID_00;
  uint uVar9;
  _xmlCatalogEntry *p_Var10;
  xmlCatalogEntryPtr pxVar11;
  _xmlCatalogEntry *p_Var12;
  xmlChar *pxVar13;
  char *pcVar14;
  xmlChar *unaff_R13;
  ulong uVar15;
  xmlChar *delegates [50];
  int local_1e4;
  xmlCatalogEntryPtr local_1d0;
  undefined8 auStack_1c8 [51];
  
  if ((catal == (xmlCatalogEntryPtr)0x0) || (pubID == (xmlChar *)0x0 && sysID == (xmlChar *)0x0)) {
    unaff_R13 = (xmlChar *)0x0;
  }
  else {
    pxVar6 = xmlCatalogNormalizePublic(pubID);
    if ((pxVar6 != (xmlChar *)0x0) && (pubID = (xmlChar *)0x0, *pxVar6 != '\0')) {
      pubID = pxVar6;
    }
    iVar4 = xmlStrncmp(pubID,(xmlChar *)"urn:publicid:",0xd);
    if (iVar4 == 0) {
      pxVar7 = xmlCatalogUnWrapURN(pubID);
      if (xmlDebugCatalogs != 0) {
        if (pxVar7 == (xmlChar *)0x0) {
          pcVar14 = "Public URN ID %s expanded to NULL\n";
        }
        else {
          pcVar14 = "Public URN ID expanded to %s\n";
          pubID = pxVar7;
        }
        xmlCatalogPrintDebug(pcVar14,pubID);
      }
      unaff_R13 = xmlCatalogListXMLResolve(catal,pxVar7,sysID);
      if (pxVar7 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar7);
      }
    }
    else {
      iVar4 = xmlStrncmp(sysID,(xmlChar *)"urn:publicid:",0xd);
      if (iVar4 == 0) {
        pxVar7 = xmlCatalogUnWrapURN(sysID);
        if (xmlDebugCatalogs != 0) {
          if (pxVar7 == (xmlChar *)0x0) {
            pcVar14 = "System URN ID %s expanded to NULL\n";
          }
          else {
            pcVar14 = "System URN ID expanded to %s\n";
            sysID = pxVar7;
          }
          xmlCatalogPrintDebug(pcVar14,sysID);
        }
        pxVar13 = pxVar7;
        if ((pubID == (xmlChar *)0x0) ||
           (iVar4 = xmlStrEqual(pubID,pxVar7), sysID_00 = pxVar7, pxVar13 = pubID, iVar4 != 0)) {
          sysID_00 = (xmlChar *)0x0;
          pubID = pxVar13;
        }
        unaff_R13 = xmlCatalogListXMLResolve(catal,pubID,sysID_00);
        if (pxVar7 != (xmlChar *)0x0) {
          (*xmlFree)(pxVar7);
        }
      }
      else {
        do {
          if (catal->type == XML_CATA_CATALOG) {
            if (catal->children == (_xmlCatalogEntry *)0x0) {
              xmlFetchXMLCatalogFile(catal);
            }
            catal_00 = catal->children;
            if (catal_00 != (xmlCatalogEntryPtr)0x0) {
              if (catal_00->depth < 0x33) {
                catal_00->depth = catal_00->depth + 1;
                if (sysID == (xmlChar *)0x0) {
                  local_1e4 = 0;
                }
                else {
                  uVar9 = 0;
                  local_1d0 = (xmlCatalogEntryPtr)0x0;
                  local_1e4 = 0;
                  iVar4 = 0;
                  p_Var10 = catal_00;
                  do {
                    switch(p_Var10->type) {
                    case XML_CATA_NEXT_CATALOG:
                      local_1e4 = local_1e4 + 1;
                      break;
                    case XML_CATA_SYSTEM:
                      iVar5 = xmlStrEqual(sysID,p_Var10->name);
                      if (iVar5 != 0) {
                        if (xmlDebugCatalogs != 0) {
                          xmlCatalogPrintDebug
                                    ("Found system match %s, using %s\n",p_Var10->name,p_Var10->URL)
                          ;
                        }
                        catal_00->depth = catal_00->depth + -1;
                        unaff_R13 = xmlStrdup(p_Var10->URL);
                        goto LAB_00162191;
                      }
                      break;
                    case XML_CATA_REWRITE_SYSTEM:
                      len = xmlStrlen(p_Var10->name);
                      if (((int)uVar9 < (int)len) &&
                         (iVar5 = xmlStrncmp(sysID,p_Var10->name,len), unaff_R13 = sysID, iVar5 == 0
                         )) {
                        uVar9 = len;
                        local_1d0 = p_Var10;
                      }
                      break;
                    case XML_CATA_DELEGATE_SYSTEM:
                      unaff_R13 = p_Var10->name;
                      iVar5 = xmlStrlen(unaff_R13);
                      iVar5 = xmlStrncmp(sysID,unaff_R13,iVar5);
                      iVar4 = iVar4 + (uint)(iVar5 == 0);
                    }
                    p_Var10 = p_Var10->next;
                  } while (p_Var10 != (_xmlCatalogEntry *)0x0);
                  if (local_1d0 == (xmlCatalogEntryPtr)0x0) {
                    if (iVar4 == 0) {
                      bVar2 = true;
                    }
                    else {
                      uVar9 = 0;
                      p_Var10 = catal_00;
                      do {
                        p_Var12 = p_Var10;
                        while (p_Var12->type == XML_CATA_DELEGATE_SYSTEM) {
                          pxVar7 = p_Var12->name;
                          iVar4 = xmlStrlen(pxVar7);
                          iVar4 = xmlStrncmp(sysID,pxVar7,iVar4);
                          if (iVar4 != 0) break;
                          pxVar11 = p_Var10;
                          if ((int)uVar9 < 1) {
LAB_001620a3:
                            if ((int)uVar9 < 0x32) {
                              lVar8 = (long)(int)uVar9;
                              uVar9 = uVar9 + 1;
                              auStack_1c8[lVar8] = pxVar11->URL;
                            }
                            if (pxVar11->children == (_xmlCatalogEntry *)0x0) {
                              xmlFetchXMLCatalogFile(pxVar11);
                            }
                            p_Var12 = pxVar11;
                            if (pxVar11->children != (_xmlCatalogEntry *)0x0) {
                              if (xmlDebugCatalogs != 0) {
                                xmlCatalogPrintDebug("Trying system delegate %s\n");
                              }
                              unaff_R13 = xmlCatalogListXMLResolve
                                                    (pxVar11->children,(xmlChar *)0x0,sysID);
                              if (unaff_R13 != (xmlChar *)0x0) goto LAB_0016217d;
                            }
                            break;
                          }
                          uVar15 = 0;
                          while (iVar4 = xmlStrEqual(p_Var12->URL,(xmlChar *)auStack_1c8[uVar15]),
                                iVar4 == 0) {
                            uVar15 = uVar15 + 1;
                            pxVar11 = p_Var12;
                            if (uVar9 == uVar15) goto LAB_001620a3;
                          }
                          p_Var12 = p_Var12->next;
                          if (p_Var12 == (_xmlCatalogEntry *)0x0) goto LAB_0016215e;
                        }
                        p_Var10 = p_Var12->next;
                      } while (p_Var10 != (_xmlCatalogEntry *)0x0);
LAB_0016215e:
                      unaff_R13 = (xmlChar *)0xffffffffffffffff;
LAB_0016217d:
                      catal_00->depth = catal_00->depth + -1;
LAB_00162191:
                      bVar2 = false;
                    }
                  }
                  else {
                    if (xmlDebugCatalogs != 0) {
                      xmlCatalogPrintDebug("Using rewriting rule %s\n");
                    }
                    pxVar7 = xmlStrdup(local_1d0->URL);
                    if (pxVar7 == (xmlChar *)0x0) {
                      unaff_R13 = (xmlChar *)0x0;
                    }
                    else {
                      unaff_R13 = xmlStrcat(pxVar7,sysID + uVar9);
                    }
                    catal_00->depth = catal_00->depth + -1;
                    bVar2 = false;
                  }
                  if (!bVar2) goto LAB_001623bb;
                }
                if (pubID != (xmlChar *)0x0) {
                  iVar4 = 0;
                  p_Var10 = catal_00;
                  do {
                    xVar1 = p_Var10->type;
                    if (xVar1 == XML_CATA_NEXT_CATALOG) {
                      local_1e4 = local_1e4 + (uint)(sysID == (xmlChar *)0x0);
                    }
                    else if (xVar1 == XML_CATA_DELEGATE_PUBLIC) {
                      pxVar7 = p_Var10->name;
                      iVar5 = xmlStrlen(pxVar7);
                      iVar5 = xmlStrncmp(pubID,pxVar7,iVar5);
                      if (iVar5 == 0) {
                        iVar4 = iVar4 + (uint)(p_Var10->prefer == XML_CATA_PREFER_PUBLIC);
                      }
                    }
                    else if ((xVar1 == XML_CATA_PUBLIC) &&
                            (iVar5 = xmlStrEqual(pubID,p_Var10->name), iVar5 != 0)) {
                      if (xmlDebugCatalogs != 0) {
                        xmlCatalogPrintDebug("Found public match %s\n");
                      }
                      catal_00->depth = catal_00->depth + -1;
                      unaff_R13 = xmlStrdup(p_Var10->URL);
                      goto LAB_001623bb;
                    }
                    p_Var10 = p_Var10->next;
                  } while (p_Var10 != (_xmlCatalogEntry *)0x0);
                  if (iVar4 != 0) {
                    uVar9 = 0;
                    p_Var10 = catal_00;
                    do {
                      p_Var12 = p_Var10;
                      while( true ) {
                        if ((p_Var12->type != XML_CATA_DELEGATE_PUBLIC) ||
                           (p_Var12->prefer != XML_CATA_PREFER_PUBLIC)) goto LAB_001622f4;
                        pxVar7 = p_Var12->name;
                        iVar4 = xmlStrlen(pxVar7);
                        iVar4 = xmlStrncmp(pubID,pxVar7,iVar4);
                        if (iVar4 != 0) goto LAB_001622f4;
                        pxVar11 = p_Var10;
                        if ((int)uVar9 < 1) break;
                        uVar15 = 0;
                        while (iVar4 = xmlStrEqual(p_Var12->URL,(xmlChar *)auStack_1c8[uVar15]),
                              iVar4 == 0) {
                          uVar15 = uVar15 + 1;
                          pxVar11 = p_Var12;
                          if (uVar9 == uVar15) goto LAB_0016228b;
                        }
                        p_Var12 = p_Var12->next;
                        if (p_Var12 == (_xmlCatalogEntry *)0x0) {
                          unaff_R13 = (xmlChar *)0xffffffffffffffff;
                          goto LAB_001623a9;
                        }
                      }
LAB_0016228b:
                      if ((int)uVar9 < 0x32) {
                        lVar8 = (long)(int)uVar9;
                        uVar9 = uVar9 + 1;
                        auStack_1c8[lVar8] = pxVar11->URL;
                      }
                      if (pxVar11->children == (_xmlCatalogEntry *)0x0) {
                        xmlFetchXMLCatalogFile(pxVar11);
                      }
                      p_Var12 = pxVar11;
                      if (pxVar11->children != (_xmlCatalogEntry *)0x0) {
                        if (xmlDebugCatalogs != 0) {
                          xmlCatalogPrintDebug("Trying public delegate %s\n",pxVar11->URL);
                        }
                        unaff_R13 = xmlCatalogListXMLResolve(pxVar11->children,pubID,(xmlChar *)0x0)
                        ;
                        if (unaff_R13 != (xmlChar *)0x0) goto LAB_001623a9;
                      }
LAB_001622f4:
                      p_Var10 = p_Var12->next;
                    } while (p_Var10 != (_xmlCatalogEntry *)0x0);
                    unaff_R13 = (xmlChar *)0xffffffffffffffff;
LAB_001623a9:
                    catal_00->depth = catal_00->depth + -1;
                    goto LAB_001623bb;
                  }
                }
                p_Var10 = catal_00;
                if (local_1e4 != 0) {
                  do {
                    if (p_Var10->type == XML_CATA_NEXT_CATALOG) {
                      if (p_Var10->children == (_xmlCatalogEntry *)0x0) {
                        xmlFetchXMLCatalogFile(p_Var10);
                      }
                      if (p_Var10->children != (xmlCatalogEntryPtr)0x0) {
                        unaff_R13 = xmlCatalogListXMLResolve(p_Var10->children,pubID,sysID);
                        if (unaff_R13 != (xmlChar *)0x0) {
                          catal_00->depth = catal_00->depth + -1;
                          goto LAB_001623bb;
                        }
                        if (0x32 < catal_00->depth) goto LAB_00162362;
                      }
                    }
                    pp_Var3 = &p_Var10->next;
                    p_Var10 = *pp_Var3;
                  } while (*pp_Var3 != (_xmlCatalogEntry *)0x0);
                }
                catal_00->depth = catal_00->depth + -1;
LAB_00162362:
                unaff_R13 = (xmlChar *)0x0;
              }
              else {
                xmlCatalogErr(catal_00,(xmlNodePtr)0x0,0x676,"Detected recursion in catalog %s\n",
                              catal_00->name,(xmlChar *)0x0,(xmlChar *)0x0);
                unaff_R13 = (xmlChar *)0x0;
              }
LAB_001623bb:
              if (unaff_R13 != (xmlChar *)0x0) goto LAB_0016246e;
              if (0x32 < catal->children->depth) break;
            }
          }
          catal = catal->next;
        } while (catal != (_xmlCatalogEntry *)0x0);
        unaff_R13 = (xmlChar *)0x0;
      }
    }
LAB_0016246e:
    if (pxVar6 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar6);
    }
  }
  return unaff_R13;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolve(xmlCatalogEntryPtr catal, const xmlChar *pubID,
	              const xmlChar *sysID) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;
    xmlChar *normid;

    if (catal == NULL)
        return(NULL);
    if ((pubID == NULL) && (sysID == NULL))
	return(NULL);

    normid = xmlCatalogNormalizePublic(pubID);
    if (normid != NULL)
        pubID = (*normid != 0 ? normid : NULL);

    if (!xmlStrncmp(pubID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(pubID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlCatalogPrintDebug(
			"Public URN ID %s expanded to NULL\n", pubID);
	    else
		xmlCatalogPrintDebug(
			"Public URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, sysID);
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    if (!xmlStrncmp(sysID, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(sysID);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlCatalogPrintDebug(
			"System URN ID %s expanded to NULL\n", sysID);
	    else
		xmlCatalogPrintDebug(
			"System URN ID expanded to %s\n", urnID);
	}
	if (pubID == NULL)
	    ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	else if (xmlStrEqual(pubID, urnID))
	    ret = xmlCatalogListXMLResolve(catal, pubID, NULL);
	else {
	    ret = xmlCatalogListXMLResolve(catal, pubID, urnID);
	}
	if (urnID != NULL)
	    xmlFree(urnID);
	if (normid != NULL)
	    xmlFree(normid);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolve(catal->children, pubID, sysID);
		if (ret != NULL) {
		    break;
                } else if (catal->children->depth > MAX_CATAL_DEPTH) {
	            ret = NULL;
		    break;
	        }
	    }
	}
	catal = catal->next;
    }
    if (normid != NULL)
	xmlFree(normid);
    return(ret);
}